

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

MaterialPackage * __thiscall
ASDCP::MXF::MaterialPackage::InitFromTLVSet(MaterialPackage *this,TLVReader *TLVSet)

{
  bool has_value;
  int iVar1;
  MDDEntry *Object;
  MDDEntry *in_RDX;
  TLVReader local_a0;
  undefined1 local_21;
  MDDEntry *local_20;
  TLVReader *TLVSet_local;
  MaterialPackage *this_local;
  Result_t *result;
  
  TLVSet_local = TLVSet;
  this_local = this;
  if (TLVSet[1].super_MemIOReader.m_p == (byte_t *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                  ,0x235,
                  "virtual ASDCP::Result_t ASDCP::MXF::MaterialPackage::InitFromTLVSet(TLVReader &)"
                 );
  }
  local_21 = 0;
  local_20 = in_RDX;
  GenericPackage::InitFromTLVSet(&this->super_GenericPackage,TLVSet);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar1) {
    Object = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MaterialPackage_PackageMarker);
    optional_property<Kumu::UUID>::get
              ((optional_property<Kumu::UUID> *)
               &TLVSet[4].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
    TLVReader::ReadObject(&local_a0,local_20,(IArchive *)Object);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_a0);
    Kumu::Result_t::~Result_t((Result_t *)&local_a0);
    has_value = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<Kumu::UUID>::set_has_value
              ((optional_property<Kumu::UUID> *)
               &TLVSet[4].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
               has_value);
  }
  return this;
}

Assistant:

ASDCP::Result_t
MaterialPackage::InitFromTLVSet(TLVReader& TLVSet)
{
  assert(m_Dict);
  Result_t result = GenericPackage::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(MaterialPackage, PackageMarker));
    PackageMarker.set_has_value( result == RESULT_OK );
  }
  return result;
}